

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

void __thiscall boost::deflate::inflate_stream_test::run(inflate_stream_test *this)

{
  ostream *this_00;
  void *this_01;
  inflate_stream_test *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cerr,"sizeof(inflate_stream) == ");
  this_01 = (void *)std::ostream::operator<<(this_00,0x1bd0);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  testInflate((IDecompressor *)this);
  testInflate(&(this->beast_decompressor).super_IDecompressor);
  testInflateErrors((IDecompressor *)this);
  testInflateErrors(&(this->beast_decompressor).super_IDecompressor);
  testInvalidSettings((IDecompressor *)this);
  testInvalidSettings(&(this->beast_decompressor).super_IDecompressor);
  testInvalidHeader((IDecompressor *)this);
  testInvalidHeader(&(this->beast_decompressor).super_IDecompressor);
  testFixedHuffmanFlushTrees((IDecompressor *)this);
  testFixedHuffmanFlushTrees(&(this->beast_decompressor).super_IDecompressor);
  testUncompressedFlushTrees((IDecompressor *)this);
  testUncompressedFlushTrees(&(this->beast_decompressor).super_IDecompressor);
  testWrappedStreams();
  return;
}

Assistant:

void run()
    {
        std::cerr <<
            "sizeof(inflate_stream) == " <<
            sizeof(inflate_stream) << std::endl;

        testInflate(zlib_decompressor);
        testInflate(beast_decompressor);
        testInflateErrors(zlib_decompressor);
        testInflateErrors(beast_decompressor);
        testInvalidSettings(zlib_decompressor);
        testInvalidSettings(beast_decompressor);
        testInvalidHeader(zlib_decompressor);
        testInvalidHeader(beast_decompressor);
        testFixedHuffmanFlushTrees(zlib_decompressor);
        testFixedHuffmanFlushTrees(beast_decompressor);
        testUncompressedFlushTrees(zlib_decompressor);
        testUncompressedFlushTrees(beast_decompressor);
        testWrappedStreams();
    }